

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O1

char * same_path(char *pixname,char *hdrname)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  
  pcVar2 = (char *)calloc(0x1ff,1);
  if (pcVar2 == (char *)0x0) {
    ffpmsg("iraffits same_path: Cannot alloc memory for newpixname");
    pcVar2 = (char *)0x0;
  }
  else {
    iVar1 = strncmp(pixname,"HDR$",4);
    if (iVar1 == 0) {
      strncpy(pcVar2,hdrname,0xff);
      uVar6 = strlen(pcVar2);
      iVar1 = (int)uVar6;
      if (0 < iVar1) {
        do {
          iVar1 = (int)uVar6;
          if (pcVar2[(uVar6 & 0xffffffff) - 1] == '/') goto LAB_001943cf;
          uVar6 = (ulong)(iVar1 - 1);
        } while (1 < iVar1);
        iVar1 = 0;
      }
LAB_001943cf:
      pcVar2[iVar1] = '\0';
      pixname = pixname + 4;
LAB_001943d9:
      pcVar2 = strncat(pcVar2,pixname,0xff);
      return pcVar2;
    }
    pcVar3 = strchr(pixname,0x2f);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strchr(pixname,0x24);
      if (pcVar3 == (char *)0x0) {
        strncpy(pcVar2,hdrname,0xff);
        uVar6 = strlen(pcVar2);
        iVar1 = (int)uVar6;
        if (0 < iVar1) {
          do {
            iVar1 = (int)uVar6;
            if (pcVar2[(uVar6 & 0xffffffff) - 1] == '/') goto LAB_0019441f;
            uVar6 = (ulong)(iVar1 - 1);
          } while (1 < iVar1);
          iVar1 = 0;
        }
LAB_0019441f:
        pcVar2[iVar1] = '\0';
        goto LAB_001943d9;
      }
    }
    iVar1 = strncmp(pixname,"HDR",3);
    if (iVar1 == 0) {
      strncpy(pcVar2,hdrname,0xff);
      sVar4 = strlen(pcVar2);
      lVar5 = sVar4 << 0x20;
      pcVar2[lVar5 + -0x300000000 >> 0x20] = 'p';
      pcVar2[lVar5 + -0x200000000 >> 0x20] = 'i';
      pcVar2[lVar5 + -0x100000000 >> 0x20] = 'x';
    }
  }
  return pcVar2;
}

Assistant:

static char *same_path (

char	*pixname,	/* IRAF pixel file pathname */
const char	*hdrname)	/* IRAF image header file pathname */

{
    int len;
    char *newpixname;

/*  WDP - 10/16/2007 - increased allocation to avoid possible overflow */
/*    newpixname = (char *) calloc (SZ_IM2PIXFILE, sizeof (char)); */

    newpixname = (char *) calloc (2*SZ_IM2PIXFILE+1, sizeof (char));
    if (newpixname == NULL) {
            ffpmsg("iraffits same_path: Cannot alloc memory for newpixname");
	    return (NULL);
	}

    /* Pixel file is in same directory as header */
    if (strncmp(pixname, "HDR$", 4) == 0 ) {
	(void)strncpy (newpixname, hdrname, SZ_IM2PIXFILE);

	/* find the end of the pathname */
	len = strlen (newpixname);
#ifndef VMS
	while( (len > 0) && (newpixname[len-1] != '/') )
#else
	while( (len > 0) && (newpixname[len-1] != ']') && (newpixname[len-1] != ':') )
#endif
	    len--;

	/* add name */
	newpixname[len] = '\0';
	(void)strncat (newpixname, &pixname[4], SZ_IM2PIXFILE);
	}

    /* Bare pixel file with no path is assumed to be same as HDR$filename */
    else if (strchr (pixname, '/') == NULL && strchr (pixname, '$') == NULL) {
	(void)strncpy (newpixname, hdrname, SZ_IM2PIXFILE);

	/* find the end of the pathname */
	len = strlen (newpixname);
#ifndef VMS
	while( (len > 0) && (newpixname[len-1] != '/') )
#else
	while( (len > 0) && (newpixname[len-1] != ']') && (newpixname[len-1] != ':') )
#endif
	    len--;

	/* add name */
	newpixname[len] = '\0';
	(void)strncat (newpixname, pixname, SZ_IM2PIXFILE);
	}

    /* Pixel file has same name as header file, but with .pix extension */
    else if (strncmp (pixname, "HDR", 3) == 0) {

	/* load entire header name string into name buffer */
	(void)strncpy (newpixname, hdrname, SZ_IM2PIXFILE);
	len = strlen (newpixname);
	newpixname[len-3] = 'p';
	newpixname[len-2] = 'i';
	newpixname[len-1] = 'x';
	}

    return (newpixname);
}